

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void finish_pass_huff(j_compress_ptr cinfo)

{
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  boolean bVar3;
  working_state state;
  working_state local_58;
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  pjVar1 = cinfo->dest;
  local_58.next_output_byte = pjVar1->next_output_byte;
  if (cinfo->progressive_mode == 0) {
    local_58.free_in_buffer = pjVar1->free_in_buffer;
    local_58.cur.put_buffer = (entropy->saved).put_buffer;
    local_58.cur.put_bits = (entropy->saved).put_bits;
    local_58.cur.last_dc_val[0] = (entropy->saved).last_dc_val[0];
    local_58.cur.last_dc_val._4_8_ = *(undefined8 *)((entropy->saved).last_dc_val + 1);
    local_58.cur._24_8_ = *(undefined8 *)((entropy->saved).last_dc_val + 3);
    local_58.cinfo = cinfo;
    bVar3 = flush_bits_s(&local_58);
    if (bVar3 == 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x19;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pjVar1 = cinfo->dest;
    pjVar1->next_output_byte = local_58.next_output_byte;
    pjVar1->free_in_buffer = local_58.free_in_buffer;
    *(undefined8 *)((entropy->saved).last_dc_val + 1) = local_58.cur.last_dc_val._4_8_;
    *(undefined8 *)((entropy->saved).last_dc_val + 3) = local_58.cur._24_8_;
    (entropy->saved).put_buffer = local_58.cur.put_buffer;
    (entropy->saved).put_bits = local_58.cur.put_bits;
    (entropy->saved).last_dc_val[0] = local_58.cur.last_dc_val[0];
  }
  else {
    entropy->next_output_byte = local_58.next_output_byte;
    entropy->free_in_buffer = pjVar1->free_in_buffer;
    emit_eobrun(entropy);
    flush_bits_e(entropy);
    pjVar1 = cinfo->dest;
    pjVar1->next_output_byte = entropy->next_output_byte;
    pjVar1->free_in_buffer = entropy->free_in_buffer;
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass_huff (j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;

  if (cinfo->progressive_mode) {
    entropy->next_output_byte = cinfo->dest->next_output_byte;
    entropy->free_in_buffer = cinfo->dest->free_in_buffer;

    /* Flush out any buffered data */
    emit_eobrun(entropy);
    flush_bits_e(entropy);

    cinfo->dest->next_output_byte = entropy->next_output_byte;
    cinfo->dest->free_in_buffer = entropy->free_in_buffer;
  } else {
    /* Load up working state ... flush_bits needs it */
    state.next_output_byte = cinfo->dest->next_output_byte;
    state.free_in_buffer = cinfo->dest->free_in_buffer;
    ASSIGN_STATE(state.cur, entropy->saved);
    state.cinfo = cinfo;

    /* Flush out the last data */
    if (! flush_bits_s(&state))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);

    /* Update state */
    cinfo->dest->next_output_byte = state.next_output_byte;
    cinfo->dest->free_in_buffer = state.free_in_buffer;
    ASSIGN_STATE(entropy->saved, state.cur);
  }
}